

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.c
# Opt level: O0

_Bool sysbvm_environment_lookSymbolRecursively
                (sysbvm_context_t *context,sysbvm_tuple_t environment,sysbvm_tuple_t symbol,
                sysbvm_tuple_t *outBinding)

{
  _Bool _Var1;
  sysbvm_environment_t *environmentObject;
  sysbvm_tuple_t *outBinding_local;
  sysbvm_tuple_t symbol_local;
  sysbvm_tuple_t environment_local;
  sysbvm_context_t *context_local;
  
  *outBinding = 0;
  _Var1 = sysbvm_tuple_isNonNullPointer(environment);
  if (_Var1) {
    if ((*(long *)(environment + 0x40) == 0) ||
       (_Var1 = sysbvm_identityDictionary_findAssociation
                          (*(sysbvm_tuple_t *)(environment + 0x40),symbol,outBinding), !_Var1)) {
      context_local._7_1_ =
           sysbvm_environment_lookSymbolRecursively
                     (context,*(sysbvm_tuple_t *)(environment + 0x30),symbol,outBinding);
    }
    else {
      context_local._7_1_ = true;
    }
  }
  else {
    context_local._7_1_ = false;
  }
  return context_local._7_1_;
}

Assistant:

SYSBVM_API bool sysbvm_environment_lookSymbolRecursively(sysbvm_context_t *context, sysbvm_tuple_t environment, sysbvm_tuple_t symbol, sysbvm_tuple_t *outBinding)
{
    *outBinding = SYSBVM_NULL_TUPLE;
    if(!sysbvm_tuple_isNonNullPointer(environment))
        return false;

    sysbvm_environment_t *environmentObject = (sysbvm_environment_t*)environment;
    if(environmentObject->symbolTable && sysbvm_identityDictionary_findAssociation(environmentObject->symbolTable, symbol, outBinding))
        return true;

    return sysbvm_environment_lookSymbolRecursively(context, environmentObject->parent, symbol, outBinding);
}